

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

char * alenumString(ALCenum x)

{
  char *pcStack_10;
  ALCenum x_local;
  
  if (x == 0) {
    pcStack_10 = "AL_NONE";
  }
  else if (x == 0x202) {
    pcStack_10 = "AL_SOURCE_RELATIVE";
  }
  else if (x == 0x1001) {
    pcStack_10 = "AL_CONE_INNER_ANGLE";
  }
  else if (x == 0x1002) {
    pcStack_10 = "AL_CONE_OUTER_ANGLE";
  }
  else if (x == 0x1003) {
    pcStack_10 = "AL_PITCH";
  }
  else if (x == 0x1004) {
    pcStack_10 = "AL_POSITION";
  }
  else if (x == 0x1005) {
    pcStack_10 = "AL_DIRECTION";
  }
  else if (x == 0x1006) {
    pcStack_10 = "AL_VELOCITY";
  }
  else if (x == 0x1007) {
    pcStack_10 = "AL_LOOPING";
  }
  else if (x == 0x1009) {
    pcStack_10 = "AL_BUFFER";
  }
  else if (x == 0x100a) {
    pcStack_10 = "AL_GAIN";
  }
  else if (x == 0x100d) {
    pcStack_10 = "AL_MIN_GAIN";
  }
  else if (x == 0x100e) {
    pcStack_10 = "AL_MAX_GAIN";
  }
  else if (x == 0x100f) {
    pcStack_10 = "AL_ORIENTATION";
  }
  else if (x == 0x1010) {
    pcStack_10 = "AL_SOURCE_STATE";
  }
  else if (x == 0x1011) {
    pcStack_10 = "AL_INITIAL";
  }
  else if (x == 0x1012) {
    pcStack_10 = "AL_PLAYING";
  }
  else if (x == 0x1013) {
    pcStack_10 = "AL_PAUSED";
  }
  else if (x == 0x1014) {
    pcStack_10 = "AL_STOPPED";
  }
  else if (x == 0x1015) {
    pcStack_10 = "AL_BUFFERS_QUEUED";
  }
  else if (x == 0x1016) {
    pcStack_10 = "AL_BUFFERS_PROCESSED";
  }
  else if (x == 0x1020) {
    pcStack_10 = "AL_REFERENCE_DISTANCE";
  }
  else if (x == 0x1021) {
    pcStack_10 = "AL_ROLLOFF_FACTOR";
  }
  else if (x == 0x1022) {
    pcStack_10 = "AL_CONE_OUTER_GAIN";
  }
  else if (x == 0x1023) {
    pcStack_10 = "AL_MAX_DISTANCE";
  }
  else if (x == 0x1024) {
    pcStack_10 = "AL_SEC_OFFSET";
  }
  else if (x == 0x1025) {
    pcStack_10 = "AL_SAMPLE_OFFSET";
  }
  else if (x == 0x1026) {
    pcStack_10 = "AL_BYTE_OFFSET";
  }
  else if (x == 0x1027) {
    pcStack_10 = "AL_SOURCE_TYPE";
  }
  else if (x == 0x1028) {
    pcStack_10 = "AL_STATIC";
  }
  else if (x == 0x1029) {
    pcStack_10 = "AL_STREAMING";
  }
  else if (x == 0x1030) {
    pcStack_10 = "AL_UNDETERMINED";
  }
  else if (x == 0x1100) {
    pcStack_10 = "AL_FORMAT_MONO8";
  }
  else if (x == 0x1101) {
    pcStack_10 = "AL_FORMAT_MONO16";
  }
  else if (x == 0x1102) {
    pcStack_10 = "AL_FORMAT_STEREO8";
  }
  else if (x == 0x1103) {
    pcStack_10 = "AL_FORMAT_STEREO16";
  }
  else if (x == 0x2001) {
    pcStack_10 = "AL_FREQUENCY";
  }
  else if (x == 0x2002) {
    pcStack_10 = "AL_BITS";
  }
  else if (x == 0x2003) {
    pcStack_10 = "AL_CHANNELS";
  }
  else if (x == 0x2004) {
    pcStack_10 = "AL_SIZE";
  }
  else if (x == 0x2010) {
    pcStack_10 = "AL_UNUSED";
  }
  else if (x == 0x2011) {
    pcStack_10 = "AL_PENDING";
  }
  else if (x == 0x2012) {
    pcStack_10 = "AL_PROCESSED";
  }
  else if (x == 0xa001) {
    pcStack_10 = "AL_INVALID_NAME";
  }
  else if (x == 0xa002) {
    pcStack_10 = "AL_INVALID_ENUM";
  }
  else if (x == 0xa003) {
    pcStack_10 = "AL_INVALID_VALUE";
  }
  else if (x == 0xa004) {
    pcStack_10 = "AL_INVALID_OPERATION";
  }
  else if (x == 0xa005) {
    pcStack_10 = "AL_OUT_OF_MEMORY";
  }
  else if (x == 0xb001) {
    pcStack_10 = "AL_VENDOR";
  }
  else if (x == 0xb002) {
    pcStack_10 = "AL_VERSION";
  }
  else if (x == 0xb003) {
    pcStack_10 = "AL_RENDERER";
  }
  else if (x == 0xb004) {
    pcStack_10 = "AL_EXTENSIONS";
  }
  else if (x == 0xc000) {
    pcStack_10 = "AL_DOPPLER_FACTOR";
  }
  else if (x == 0xc001) {
    pcStack_10 = "AL_DOPPLER_VELOCITY";
  }
  else if (x == 0xc003) {
    pcStack_10 = "AL_SPEED_OF_SOUND";
  }
  else if (x == 0xd000) {
    pcStack_10 = "AL_DISTANCE_MODEL";
  }
  else if (x == 0xd001) {
    pcStack_10 = "AL_INVERSE_DISTANCE";
  }
  else if (x == 0xd002) {
    pcStack_10 = "AL_INVERSE_DISTANCE_CLAMPED";
  }
  else if (x == 0xd003) {
    pcStack_10 = "AL_LINEAR_DISTANCE";
  }
  else if (x == 0xd004) {
    pcStack_10 = "AL_LINEAR_DISTANCE_CLAMPED";
  }
  else if (x == 0xd005) {
    pcStack_10 = "AL_EXPONENT_DISTANCE";
  }
  else if (x == 0xd006) {
    pcStack_10 = "AL_EXPONENT_DISTANCE_CLAMPED";
  }
  else if (x == 0x10010) {
    pcStack_10 = "AL_FORMAT_MONO_FLOAT32";
  }
  else if (x == 0x10011) {
    pcStack_10 = "AL_FORMAT_STEREO_FLOAT32";
  }
  else {
    pcStack_10 = sprintf_alloc("0x%X",(ulong)(uint)x);
  }
  return pcStack_10;
}

Assistant:

const char *alenumString(const ALCenum x)
{
    switch (x) {
        #define ENUM_TEST(e) case e: return #e
        ENUM_TEST(AL_NONE);
        ENUM_TEST(AL_SOURCE_RELATIVE);
        ENUM_TEST(AL_CONE_INNER_ANGLE);
        ENUM_TEST(AL_CONE_OUTER_ANGLE);
        ENUM_TEST(AL_PITCH);
        ENUM_TEST(AL_POSITION);
        ENUM_TEST(AL_DIRECTION);
        ENUM_TEST(AL_VELOCITY);
        ENUM_TEST(AL_LOOPING);
        ENUM_TEST(AL_BUFFER);
        ENUM_TEST(AL_GAIN);
        ENUM_TEST(AL_MIN_GAIN);
        ENUM_TEST(AL_MAX_GAIN);
        ENUM_TEST(AL_ORIENTATION);
        ENUM_TEST(AL_SOURCE_STATE);
        ENUM_TEST(AL_INITIAL);
        ENUM_TEST(AL_PLAYING);
        ENUM_TEST(AL_PAUSED);
        ENUM_TEST(AL_STOPPED);
        ENUM_TEST(AL_BUFFERS_QUEUED);
        ENUM_TEST(AL_BUFFERS_PROCESSED);
        ENUM_TEST(AL_REFERENCE_DISTANCE);
        ENUM_TEST(AL_ROLLOFF_FACTOR);
        ENUM_TEST(AL_CONE_OUTER_GAIN);
        ENUM_TEST(AL_MAX_DISTANCE);
        ENUM_TEST(AL_SEC_OFFSET);
        ENUM_TEST(AL_SAMPLE_OFFSET);
        ENUM_TEST(AL_BYTE_OFFSET);
        ENUM_TEST(AL_SOURCE_TYPE);
        ENUM_TEST(AL_STATIC);
        ENUM_TEST(AL_STREAMING);
        ENUM_TEST(AL_UNDETERMINED);
        ENUM_TEST(AL_FORMAT_MONO8);
        ENUM_TEST(AL_FORMAT_MONO16);
        ENUM_TEST(AL_FORMAT_STEREO8);
        ENUM_TEST(AL_FORMAT_STEREO16);
        ENUM_TEST(AL_FREQUENCY);
        ENUM_TEST(AL_BITS);
        ENUM_TEST(AL_CHANNELS);
        ENUM_TEST(AL_SIZE);
        ENUM_TEST(AL_UNUSED);
        ENUM_TEST(AL_PENDING);
        ENUM_TEST(AL_PROCESSED);
        ENUM_TEST(AL_INVALID_NAME);
        ENUM_TEST(AL_INVALID_ENUM);
        ENUM_TEST(AL_INVALID_VALUE);
        ENUM_TEST(AL_INVALID_OPERATION);
        ENUM_TEST(AL_OUT_OF_MEMORY);
        ENUM_TEST(AL_VENDOR);
        ENUM_TEST(AL_VERSION);
        ENUM_TEST(AL_RENDERER);
        ENUM_TEST(AL_EXTENSIONS);
        ENUM_TEST(AL_DOPPLER_FACTOR);
        ENUM_TEST(AL_DOPPLER_VELOCITY);
        ENUM_TEST(AL_SPEED_OF_SOUND);
        ENUM_TEST(AL_DISTANCE_MODEL);
        ENUM_TEST(AL_INVERSE_DISTANCE);
        ENUM_TEST(AL_INVERSE_DISTANCE_CLAMPED);
        ENUM_TEST(AL_LINEAR_DISTANCE);
        ENUM_TEST(AL_LINEAR_DISTANCE_CLAMPED);
        ENUM_TEST(AL_EXPONENT_DISTANCE);
        ENUM_TEST(AL_EXPONENT_DISTANCE_CLAMPED);
        ENUM_TEST(AL_FORMAT_MONO_FLOAT32);
        ENUM_TEST(AL_FORMAT_STEREO_FLOAT32);
        #undef ENUM_TEST
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}